

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_file.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::javanano::FileGenerator::Validate(FileGenerator *this,string *error)

{
  Params *this_00;
  SourceCodeInfo *pSVar1;
  bool bVar2;
  bool bVar3;
  __type _Var4;
  int iVar5;
  string *psVar6;
  ostream *poVar7;
  Descriptor *this_01;
  EnumDescriptor *this_02;
  int local_114;
  int local_110;
  int i_1;
  int i;
  bool found_conflict;
  undefined1 local_f8 [8];
  FileDescriptorProto file_proto;
  string *error_local;
  FileGenerator *this_local;
  
  file_proto.source_code_info_ = (SourceCodeInfo *)error;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_f8);
  FileDescriptor::CopyTo(this->file_,(FileDescriptorProto *)local_f8);
  bVar2 = anon_unknown_2::UsesExtensions((Message *)local_f8);
  if ((!bVar2) ||
     (bVar2 = Params::store_unknown_fields(this->params_), pSVar1 = file_proto.source_code_info_,
     bVar2)) {
    iVar5 = FileDescriptor::service_count(this->file_);
    if ((iVar5 == 0) ||
       (bVar2 = Params::ignore_services(this->params_), pSVar1 = file_proto.source_code_info_, bVar2
       )) {
      bVar2 = IsOuterClassNeeded(this->params_,this->file_);
      if (bVar2) {
        this_00 = this->params_;
        psVar6 = FileDescriptor::name_abi_cxx11_(this->file_);
        bVar2 = Params::has_java_outer_classname(this_00,psVar6);
        if ((((!bVar2) && (iVar5 = FileDescriptor::message_type_count(this->file_), iVar5 == 1)) &&
            (iVar5 = FileDescriptor::enum_type_count(this->file_), iVar5 == 0)) &&
           (iVar5 = FileDescriptor::extension_count(this->file_), iVar5 == 0)) {
          poVar7 = std::operator<<((ostream *)&std::cout,"INFO: ");
          psVar6 = FileDescriptor::name_abi_cxx11_(this->file_);
          poVar7 = std::operator<<(poVar7,(string *)psVar6);
          poVar7 = std::operator<<(poVar7,":");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<((ostream *)&std::cout,
                                   "Javanano generator has changed to align with java generator. An outer class will be created for this file and the single message in the file will become a nested class. Use java_multiple_files to skip generating the outer class, or set an explicit java_outer_classname to suppress this message."
                                  );
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        bVar2 = false;
        local_110 = 0;
        while( true ) {
          bVar3 = false;
          if (!bVar2) {
            iVar5 = FileDescriptor::message_type_count(this->file_);
            bVar3 = local_110 < iVar5;
          }
          if (!bVar3) break;
          this_01 = FileDescriptor::message_type(this->file_,local_110);
          psVar6 = Descriptor::name_abi_cxx11_(this_01);
          _Var4 = std::operator==(psVar6,&this->classname_);
          if (_Var4) {
            bVar2 = true;
          }
          local_110 = local_110 + 1;
        }
        bVar3 = Params::java_enum_style(this->params_);
        if (bVar3) {
          local_114 = 0;
          while( true ) {
            bVar3 = false;
            if (!bVar2) {
              iVar5 = FileDescriptor::enum_type_count(this->file_);
              bVar3 = local_114 < iVar5;
            }
            if (!bVar3) break;
            this_02 = FileDescriptor::enum_type(this->file_,local_114);
            psVar6 = EnumDescriptor::name_abi_cxx11_(this_02);
            _Var4 = std::operator==(psVar6,&this->classname_);
            if (_Var4) {
              bVar2 = true;
            }
            local_114 = local_114 + 1;
          }
        }
        pSVar1 = file_proto.source_code_info_;
        if (bVar2) {
          FileDescriptor::name_abi_cxx11_(this->file_);
          std::__cxx11::string::assign((string *)pSVar1);
          std::__cxx11::string::append((char *)file_proto.source_code_info_);
          std::__cxx11::string::append((string *)file_proto.source_code_info_);
          std::__cxx11::string::append((char *)file_proto.source_code_info_);
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      FileDescriptor::name_abi_cxx11_(this->file_);
      std::__cxx11::string::assign((string *)pSVar1);
      std::__cxx11::string::append((char *)file_proto.source_code_info_);
      this_local._7_1_ = false;
    }
  }
  else {
    FileDescriptor::name_abi_cxx11_(this->file_);
    std::__cxx11::string::assign((string *)pSVar1);
    std::__cxx11::string::append((char *)file_proto.source_code_info_);
    this_local._7_1_ = false;
  }
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_f8);
  return this_local._7_1_;
}

Assistant:

bool FileGenerator::Validate(string* error) {
  // Check for extensions
  FileDescriptorProto file_proto;
  file_->CopyTo(&file_proto);
  if (UsesExtensions(file_proto) && !params_.store_unknown_fields()) {
    error->assign(file_->name());
    error->append(
        ": Java NANO_RUNTIME only supports extensions when the "
        "'store_unknown_fields' generator option is 'true'.");
    return false;
  }

  if (file_->service_count() != 0 && !params_.ignore_services()) {
    error->assign(file_->name());
    error->append(
      ": Java NANO_RUNTIME does not support services\"");
    return false;
  }

  if (!IsOuterClassNeeded(params_, file_)) {
    return true;
  }

  // Check whether legacy javanano generator would omit the outer class.
  if (!params_.has_java_outer_classname(file_->name())
      && file_->message_type_count() == 1
      && file_->enum_type_count() == 0 && file_->extension_count() == 0) {
    cout << "INFO: " << file_->name() << ":" << endl;
    cout << "Javanano generator has changed to align with java generator. "
        "An outer class will be created for this file and the single message "
        "in the file will become a nested class. Use java_multiple_files to "
        "skip generating the outer class, or set an explicit "
        "java_outer_classname to suppress this message." << endl;
  }

  // Check that no class name matches the file's class name.  This is a common
  // problem that leads to Java compile errors that can be hard to understand.
  // It's especially bad when using the java_multiple_files, since we would
  // end up overwriting the outer class with one of the inner ones.
  bool found_conflict = false;
  for (int i = 0; !found_conflict && i < file_->message_type_count(); i++) {
    if (file_->message_type(i)->name() == classname_) {
      found_conflict = true;
    }
  }
  if (params_.java_enum_style()) {
    for (int i = 0; !found_conflict && i < file_->enum_type_count(); i++) {
      if (file_->enum_type(i)->name() == classname_) {
        found_conflict = true;
      }
    }
  }
  if (found_conflict) {
    error->assign(file_->name());
    error->append(
      ": Cannot generate Java output because the file's outer class name, \"");
    error->append(classname_);
    error->append(
      "\", matches the name of one of the types declared inside it.  "
      "Please either rename the type or use the java_outer_classname "
      "option to specify a different outer class name for the .proto file.");
    return false;
  }
  return true;
}